

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::UdpEdgeFieldSyntax::setChild
          (UdpEdgeFieldSyntax *this,size_t index,TokenOrSyntax child)

{
  Token *pTVar1;
  undefined8 uVar2;
  Token TVar3;
  
  TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
  uVar2 = TVar3._0_8_;
  pTVar1 = &this->openParen + index;
  pTVar1->kind = (short)uVar2;
  pTVar1->field_0x2 = (char)((ulong)uVar2 >> 0x10);
  pTVar1->numFlags = (NumericTokenFlags)(char)((ulong)uVar2 >> 0x18);
  pTVar1->rawLen = (int)((ulong)uVar2 >> 0x20);
  (&this->openParen)[index].info = TVar3.info;
  return;
}

Assistant:

void UdpEdgeFieldSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: first = child.token(); return;
        case 2: second = child.token(); return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}